

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

JSONWriter * __thiscall
hgdb::json::JSONWriter::value<std::__cxx11::string>
          (JSONWriter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
          )

{
  undefined1 *puVar1;
  ostream *poVar2;
  char *in_RCX;
  string_view value_00;
  string local_48;
  
  puVar1 = &(this->s_).field_0x10;
  poVar2 = std::operator<<((ostream *)puVar1,'\"');
  value_00._M_str = in_RCX;
  value_00._M_len = (size_t)(value->_M_dataplus)._M_p;
  escape_abi_cxx11_(&local_48,(JSONWriter *)value->_M_string_length,value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_48);
  std::operator<<(poVar2,'\"');
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)puVar1,',');
  return this;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }